

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O0

int __thiscall TokenBuffer::LA(TokenBuffer *this,int i)

{
  int iVar1;
  Token *this_00;
  undefined4 in_ESI;
  undefined8 in_RDI;
  CircularQueue<RefCount<Token>_> *this_01;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  fill((TokenBuffer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  this_01 = (CircularQueue<RefCount<Token>_> *)&stack0xffffffffffffffe8;
  CircularQueue<RefCount<Token>_>::elementAt(this_01,(int)((ulong)in_RDI >> 0x20));
  this_00 = RefCount<Token>::operator->((RefCount<Token> *)this_01);
  iVar1 = this_00->type;
  RefCount<Token>::~RefCount((RefCount<Token> *)this_00);
  return iVar1;
}

Assistant:

int TokenBuffer::LA(int i)
{
	fill(i);
	return queue.elementAt(markerOffset+i-1)->type;
}